

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void lowbd_fwd_txfm2d_16x32_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  code *pcVar2;
  code *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  undefined1 auVar10 [32];
  int8_t *piVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  undefined7 in_register_00000009;
  __m256i *palVar15;
  int32_t *piVar16;
  long lVar17;
  longlong *plVar18;
  __m256i *out;
  bool bVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  __m256i buf0 [32];
  __m256i buf1 [32];
  undefined2 local_880;
  undefined2 uStack_87e;
  undefined2 uStack_87c;
  undefined2 uStack_87a;
  undefined2 uStack_878;
  undefined2 uStack_876;
  undefined2 uStack_874;
  undefined2 uStack_872;
  undefined2 uStack_870;
  undefined2 uStack_86e;
  undefined2 uStack_86c;
  undefined2 uStack_86a;
  undefined2 uStack_868;
  undefined2 uStack_866;
  undefined2 uStack_864;
  undefined2 uStack_862;
  longlong local_860 [192];
  longlong local_260 [70];
  
  piVar11 = av1_fwd_txfm_shift_ls[9];
  uVar12 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    lVar17 = 0x400;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)((long)&local_880 + lVar17) = *(undefined8 *)input;
      *(undefined8 *)((long)&uStack_878 + lVar17) = uVar4;
      *(undefined8 *)((long)&uStack_870 + lVar17) = uVar5;
      *(undefined8 *)((long)&uStack_868 + lVar17) = uVar6;
      input = input + stride;
      lVar17 = lVar17 + -0x20;
    } while (lVar17 != 0);
  }
  else {
    lVar17 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)((long)local_860 + lVar17) = *(undefined8 *)input;
      *(undefined8 *)((long)local_860 + lVar17 + 8) = uVar4;
      *(undefined8 *)((long)local_860 + lVar17 + 0x10) = uVar5;
      *(undefined8 *)((long)local_860 + lVar17 + 0x18) = uVar6;
      lVar17 = lVar17 + 0x20;
      input = input + stride;
    } while (lVar17 != 0x400);
  }
  pcVar2 = *(code **)((long)col_txfm16x32_arr + uVar12);
  bVar1 = *av1_fwd_txfm_shift_ls[9];
  uVar14 = (uint)(char)bVar1;
  if ((int)uVar14 < 0) {
    auVar21._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar21._2_2_ = auVar21._0_2_;
    auVar21._4_2_ = auVar21._0_2_;
    auVar21._6_2_ = auVar21._0_2_;
    auVar21._8_2_ = auVar21._0_2_;
    auVar21._10_2_ = auVar21._0_2_;
    auVar21._12_2_ = auVar21._0_2_;
    auVar21._14_2_ = auVar21._0_2_;
    auVar21._16_2_ = auVar21._0_2_;
    auVar21._18_2_ = auVar21._0_2_;
    auVar21._20_2_ = auVar21._0_2_;
    auVar21._22_2_ = auVar21._0_2_;
    auVar21._24_2_ = auVar21._0_2_;
    auVar21._26_2_ = auVar21._0_2_;
    auVar21._28_2_ = auVar21._0_2_;
    auVar21._30_2_ = auVar21._0_2_;
    lVar17 = 0;
    do {
      auVar20 = vpaddsw_avx2(auVar21,*(undefined1 (*) [32])((long)local_860 + lVar17));
      auVar20 = vpsraw_avx2(auVar20,ZEXT416(-uVar14));
      *(undefined1 (*) [32])((long)local_860 + lVar17) = auVar20;
      lVar17 = lVar17 + 0x20;
    } while (lVar17 != 0x400);
  }
  else if (bVar1 != 0) {
    lVar17 = 0;
    do {
      auVar21 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_860 + lVar17),ZEXT416(uVar14));
      *(undefined1 (*) [32])((long)local_860 + lVar17) = auVar21;
      lVar17 = lVar17 + 0x20;
    } while (lVar17 != 0x400);
  }
  pcVar3 = *(code **)((long)row_txfm16x16_arr + uVar12);
  (*pcVar2)(local_860,local_860,0xc);
  bVar1 = piVar11[1];
  if ((char)bVar1 < '\0') {
    auVar20._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar20._2_2_ = auVar20._0_2_;
    auVar20._4_2_ = auVar20._0_2_;
    auVar20._6_2_ = auVar20._0_2_;
    auVar20._8_2_ = auVar20._0_2_;
    auVar20._10_2_ = auVar20._0_2_;
    auVar20._12_2_ = auVar20._0_2_;
    auVar20._14_2_ = auVar20._0_2_;
    auVar20._16_2_ = auVar20._0_2_;
    auVar20._18_2_ = auVar20._0_2_;
    auVar20._20_2_ = auVar20._0_2_;
    auVar20._22_2_ = auVar20._0_2_;
    auVar20._24_2_ = auVar20._0_2_;
    auVar20._26_2_ = auVar20._0_2_;
    auVar20._28_2_ = auVar20._0_2_;
    auVar20._30_2_ = auVar20._0_2_;
    lVar17 = 0;
    do {
      auVar21 = vpaddsw_avx2(auVar20,*(undefined1 (*) [32])((long)local_860 + lVar17));
      auVar21 = vpsraw_avx2(auVar21,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [32])((long)local_860 + lVar17) = auVar21;
      lVar17 = lVar17 + 0x20;
    } while (lVar17 != 0x400);
  }
  else if (bVar1 != 0) {
    lVar17 = 0;
    do {
      auVar21 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_860 + lVar17),
                            ZEXT416((uint)(int)(char)bVar1));
      *(undefined1 (*) [32])((long)local_860 + lVar17) = auVar21;
      lVar17 = lVar17 + 0x20;
    } while (lVar17 != 0x400);
  }
  out = (__m256i *)(local_860 + 0x80);
  transpose_16bit_16x16_avx2((__m256i *)local_860,out);
  transpose_16bit_16x16_avx2((__m256i *)(local_860 + 0x40),(__m256i *)local_260);
  piVar16 = output + 8;
  local_880 = 1;
  uStack_87e = 1;
  uStack_87c = 1;
  uStack_87a = 1;
  uStack_878 = 1;
  uStack_876 = 1;
  uStack_874 = 1;
  uStack_872 = 1;
  uStack_870 = 1;
  uStack_86e = 1;
  uStack_86c = 1;
  uStack_86a = 1;
  uStack_868 = 1;
  uStack_866 = 1;
  uStack_864 = 1;
  uStack_862 = 1;
  lVar17 = 0;
  do {
    if (tx_type < 0x10 && (0x7f1fU >> (tx_type & 0x1f) & 1) == 0) {
      lVar13 = 0x200;
      palVar15 = out;
      do {
        lVar7 = (*palVar15)[1];
        lVar8 = (*palVar15)[2];
        lVar9 = (*palVar15)[3];
        *(longlong *)((long)&local_880 + lVar13) = (*palVar15)[0];
        *(longlong *)((long)&uStack_878 + lVar13) = lVar7;
        *(longlong *)((long)&uStack_870 + lVar13) = lVar8;
        *(longlong *)((long)&uStack_868 + lVar13) = lVar9;
        palVar15 = palVar15 + 1;
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != 0);
      plVar18 = local_860;
    }
    else {
      plVar18 = local_260 + lVar17 * 0x40 + -0x40;
    }
    (*pcVar3)(plVar18,plVar18,0xd);
    bVar1 = piVar11[2];
    if ((char)bVar1 < '\0') {
      auVar22._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar22._2_2_ = auVar22._0_2_;
      auVar22._4_2_ = auVar22._0_2_;
      auVar22._6_2_ = auVar22._0_2_;
      auVar22._8_2_ = auVar22._0_2_;
      auVar22._10_2_ = auVar22._0_2_;
      auVar22._12_2_ = auVar22._0_2_;
      auVar22._14_2_ = auVar22._0_2_;
      auVar22._16_2_ = auVar22._0_2_;
      auVar22._18_2_ = auVar22._0_2_;
      auVar22._20_2_ = auVar22._0_2_;
      auVar22._22_2_ = auVar22._0_2_;
      auVar22._24_2_ = auVar22._0_2_;
      auVar22._26_2_ = auVar22._0_2_;
      auVar22._28_2_ = auVar22._0_2_;
      auVar22._30_2_ = auVar22._0_2_;
      lVar13 = 0;
      auVar23._8_4_ = 0x80016a1;
      auVar23._0_8_ = 0x80016a1080016a1;
      auVar23._12_4_ = 0x80016a1;
      auVar23._16_4_ = 0x80016a1;
      auVar23._20_4_ = 0x80016a1;
      auVar23._24_4_ = 0x80016a1;
      auVar23._28_4_ = 0x80016a1;
      do {
        auVar21 = vpaddsw_avx2(auVar22,*(undefined1 (*) [32])((long)plVar18 + lVar13));
        auVar21 = vpsraw_avx2(auVar21,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar18 + lVar13) = auVar21;
        lVar13 = lVar13 + 0x20;
      } while (lVar13 != 0x200);
    }
    else {
      auVar23._8_4_ = 0x80016a1;
      auVar23._0_8_ = 0x80016a1080016a1;
      auVar23._12_4_ = 0x80016a1;
      auVar23._16_4_ = 0x80016a1;
      auVar23._20_4_ = 0x80016a1;
      auVar23._24_4_ = 0x80016a1;
      auVar23._28_4_ = 0x80016a1;
      if (bVar1 != 0) {
        lVar13 = 0;
        do {
          auVar21 = vpsllw_avx2(*(undefined1 (*) [32])((long)plVar18 + lVar13),
                                ZEXT416((uint)(int)(char)bVar1));
          *(undefined1 (*) [32])((long)plVar18 + lVar13) = auVar21;
          lVar13 = lVar13 + 0x20;
        } while (lVar13 != 0x200);
      }
    }
    lVar13 = 0;
    auVar10._2_2_ = uStack_87e;
    auVar10._0_2_ = local_880;
    auVar10._4_2_ = uStack_87c;
    auVar10._6_2_ = uStack_87a;
    auVar10._8_2_ = uStack_878;
    auVar10._10_2_ = uStack_876;
    auVar10._12_2_ = uStack_874;
    auVar10._14_2_ = uStack_872;
    auVar10._16_2_ = uStack_870;
    auVar10._18_2_ = uStack_86e;
    auVar10._20_2_ = uStack_86c;
    auVar10._22_2_ = uStack_86a;
    auVar10._24_2_ = uStack_868;
    auVar10._26_2_ = uStack_866;
    auVar10._28_2_ = uStack_864;
    auVar10._30_2_ = uStack_862;
    do {
      auVar20 = vpermq_avx2(*(undefined1 (*) [32])((long)plVar18 + lVar13),0xd8);
      auVar21 = vpunpcklwd_avx2(auVar20,auVar10);
      auVar20 = vpunpckhwd_avx2(auVar20,auVar10);
      auVar21 = vpmaddwd_avx2(auVar21,auVar23);
      auVar22 = vpsrad_avx2(auVar21,0xc);
      auVar21 = vpmaddwd_avx2(auVar20,auVar23);
      auVar21 = vpsrad_avx2(auVar21,0xc);
      *(undefined1 (*) [32])(piVar16 + lVar13 + -8) = auVar22;
      *(undefined1 (*) [32])(piVar16 + lVar13) = auVar21;
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x200);
    out = out + 0x10;
    piVar16 = piVar16 + 0x10;
    bVar19 = lVar17 == 0;
    lVar17 = lVar17 + 1;
  } while (bVar19);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_16x32_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_16X32;
  __m256i buf0[32], buf1[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm16x32_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm16x16_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip_avx2(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit_avx2(input, stride, buf0, height);
  }
  round_shift_16bit_w16_avx2(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit_w16_avx2(buf0, height, shift[1]);
  transpose_16bit_16x16_avx2(buf0, buf1);
  transpose_16bit_16x16_avx2(buf0 + 16, buf1 + 16);

  for (int i = 0; i < 2; i++) {
    __m256i *buf;
    if (lr_flip) {
      buf = buf0;
      flip_buf_avx2(buf1 + width * i, buf, width);
    } else {
      buf = buf1 + width * i;
    }
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit_w16_avx2(buf, width, shift[2]);
    store_rect_buffer_16bit_to_32bit_w16_avx2(buf, output + i * 16, height,
                                              width);
  }
}